

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O1

void __thiscall scheduler_tests::manythreads::test_method(manythreads *this)

{
  CScheduler *pCVar1;
  ulong uVar2;
  Function f_00;
  Function f_01;
  undefined8 uVar3;
  long lVar4;
  size_t sVar5;
  uint64_t uVar6;
  CScheduler *pCVar7;
  uint64_t uVar8;
  int iVar9;
  thread *thread;
  id iVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  time_point unaff_R12;
  CScheduler *pCVar13;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  int counterSum;
  vector<std::thread,_std::allocator<std::thread>_> microThreads;
  time_point last;
  time_point first;
  Function f;
  FastRandomContext rng;
  int counter [10];
  mutex counterMutex [10];
  CScheduler microTasks;
  undefined4 uVar14;
  undefined4 uVar15;
  check_type cVar16;
  _Manager_type in_stack_fffffffffffffa88;
  _Invoker_type in_stack_fffffffffffffa90;
  undefined4 local_544;
  undefined1 local_540 [16];
  undefined1 *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  int local_4cc;
  undefined1 local_4c8 [16];
  code *local_4b8;
  undefined1 local_4a8 [32];
  char *local_488 [2];
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  _Base_ptr local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  undefined1 local_3f8 [16];
  code *local_3e8;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  time_point local_3a8;
  time_point local_3a0;
  undefined4 *local_398;
  assertion_result local_390;
  undefined4 **local_378;
  int *local_370;
  _Any_data local_368;
  _Head_base<0UL,_CScheduler_*,_false> local_358;
  int **ppiStack_350;
  char *local_348;
  char *local_340;
  assertion_result local_338;
  FastRandomContext local_320;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined1 local_268 [408];
  CScheduler local_d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CScheduler::CScheduler(&local_d0);
  memset(local_268,0,400);
  local_278 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  FastRandomContext::FastRandomContext(&local_320,true);
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_3a0.__d.__r = (duration)0;
  local_3a8.__d.__r = (duration)0;
  sVar5 = CScheduler::getQueueInfo(&local_d0,&local_3a0,&local_3a8);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  pCVar13 = (CScheduler *)0xec4f6c;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x38;
  file.m_begin = (iterator)&local_3b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3c8,msg);
  local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar5 == 0);
  local_390.m_message.px = (element_type *)0x0;
  local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ppiStack_350 = (int **)local_540;
  local_540._0_8_ = "nTasks == 0";
  local_540._8_8_ = "";
  local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
  local_368._M_unused._M_object = &PTR__lazy_ostream_013abc70;
  local_358._M_head_impl = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_3d0 = "";
  uVar14 = 0;
  uVar15 = 0;
  iVar9 = 0;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_390,(lazy_ostream *)&local_368,1,0,WARN,_cVar16,(size_t)&local_3d8,0x38);
  boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
  do {
    do {
      uVar6 = RandomMixin<FastRandomContext>::randbits
                        (&local_320.super_RandomMixin<FastRandomContext>,10);
    } while (0x3f3 < uVar6);
    do {
      pCVar7 = (CScheduler *)
               RandomMixin<FastRandomContext>::randbits
                         (&local_320.super_RandomMixin<FastRandomContext>,10);
      pCVar1 = pCVar13;
      if ((CScheduler *)0x3f3 >= pCVar7) {
        pCVar1 = pCVar7;
      }
      pCVar13 = (CScheduler *)((ulong)pCVar1 & 0xffffffff);
    } while ((CScheduler *)0x3f3 < pCVar7);
    do {
      uVar6 = RandomMixin<FastRandomContext>::randbits
                        (&local_320.super_RandomMixin<FastRandomContext>,4);
      uVar2 = (ulong)unaff_R12.__d.__r;
      if (9 >= uVar6) {
        uVar2 = uVar6;
      }
      unaff_R12.__d.__r = (duration)(uVar2 & 0xffffffff);
    } while (9 < uVar6);
    do {
      uVar6 = RandomMixin<FastRandomContext>::randbits
                        (&local_320.super_RandomMixin<FastRandomContext>,0xb);
    } while (2000 < uVar6);
    local_358._M_head_impl = (CScheduler *)0x0;
    ppiStack_350 = (int **)0x0;
    local_368._M_unused._M_object = (_func_int **)0x0;
    local_368._8_8_ = 0;
    local_368._M_unused._M_object = operator_new(0x30);
    *(code **)local_368._M_unused._0_8_ = microTask;
    *(_func_int **)((long)local_368._M_unused._0_8_ + 8) =
         (_func_int *)((long)((int)pCVar1 + 0x1e9) * 1000 + lVar4);
    *(int *)((long)local_368._M_unused._0_8_ + 0x10) = (int)uVar6 + -1000;
    *(_func_int **)((long)local_368._M_unused._0_8_ + 0x18) =
         (_func_int *)((long)&local_298 + (long)(int)uVar2 * 4);
    *(undefined1 **)((long)local_368._M_unused._0_8_ + 0x20) = local_268 + (long)(int)uVar2 * 0x28;
    pCVar13 = &local_d0;
    *(CScheduler **)((long)local_368._M_unused._0_8_ + 0x28) = pCVar13;
    ppiStack_350 = (int **)std::
                           _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>_>
                           ::_M_invoke;
    local_358._M_head_impl =
         (CScheduler *)
         std::
         _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>_>
         ::_M_manager;
    unaff_R12.__d.__r = (duration)local_3f8;
    std::function<void_()>::function
              ((function<void_()> *)unaff_R12.__d.__r,(function<void_()> *)&local_368);
    f_00.super__Function_base._M_functor._4_4_ = uVar15;
    f_00.super__Function_base._M_functor._0_4_ = uVar14;
    f_00.super__Function_base._M_functor._8_8_ = (undefined8)_cVar16;
    f_00.super__Function_base._M_manager = in_stack_fffffffffffffa88;
    f_00._M_invoker = in_stack_fffffffffffffa90;
    CScheduler::schedule(pCVar13,f_00,unaff_R12);
    if (local_3e8 != (code *)0x0) {
      (*local_3e8)(unaff_R12.__d.__r,unaff_R12.__d.__r,3);
    }
    if (local_358._M_head_impl != (CScheduler *)0x0) {
      (*(code *)local_358._M_head_impl)(&local_368,&local_368,3);
    }
    iVar9 = iVar9 + 1;
  } while (iVar9 != 100);
  sVar5 = CScheduler::getQueueInfo(&local_d0,&local_3a0,&local_3a8);
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x44;
  file_00.m_begin = (iterator)&local_408;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_418,
             msg_00);
  local_390.m_message.px = (element_type *)0x0;
  local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540._0_8_ = "nTasks == 100";
  local_540._8_8_ = "";
  local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
  local_368._M_unused._M_object = &PTR__lazy_ostream_013abc70;
  local_358._M_head_impl = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  ppiStack_350 = (int **)local_540;
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_420 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(sVar5 == 100);
  boost::test_tools::tt_detail::report_assertion
            (&local_390,(lazy_ostream *)&local_368,1,0,WARN,_cVar16,(size_t)&local_428,0x44);
  boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_430 = (_Base_ptr)0xec4f6c;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x45;
  file_01.m_begin = (iterator)&local_438;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_448,
             msg_01);
  local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((long)local_3a0.__d.__r < (long)local_3a8.__d.__r);
  local_390.m_message.px = (element_type *)0x0;
  local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540._0_8_ = "first < last";
  local_540._8_8_ = "";
  local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
  local_368._M_unused._M_object = &PTR__lazy_ostream_013abc70;
  local_358._M_head_impl = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  ppiStack_350 = (int **)local_540;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_450 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_390,(lazy_ostream *)&local_368,1,0,WARN,_cVar16,(size_t)&local_458,0x45);
  boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x46;
  file_02.m_begin = (iterator)&local_468;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_478,
             msg_02);
  local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(lVar4 < (long)local_3a8.__d.__r);
  local_390.m_message.px = (element_type *)0x0;
  local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_540._0_8_ = "last > now";
  local_540._8_8_ = "";
  local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
  local_368._M_unused._M_object = &PTR__lazy_ostream_013abc70;
  local_358._M_head_impl = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  ppiStack_350 = (int **)local_540;
  local_488[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_488[1] = "";
  uVar14 = 0;
  uVar15 = 0;
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_390,(lazy_ostream *)&local_368,1,0,WARN,_cVar16,(size_t)local_488,0x46);
  boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
  local_4a8._0_8_ = 0;
  local_4a8._8_8_ = (pointer)0x0;
  local_4a8._16_8_ = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_4a8,10);
  iVar9 = 5;
  pCVar13 = (CScheduler *)local_4a8;
  do {
    local_368._M_unused._M_object = CScheduler::serviceQueue;
    local_368._8_8_ = 0;
    local_358._M_head_impl = &local_d0;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::_Bind<void(CScheduler::*(CScheduler*))()>>
              ((vector<std::thread,std::allocator<std::thread>> *)pCVar13,
               (_Bind<void_(CScheduler::*(CScheduler_*))()> *)&local_368);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  local_368._M_unused._M_member_pointer = 600;
  UninterruptibleSleep((microseconds *)&local_368);
  iVar9 = 5;
  lVar4 = std::chrono::_V2::steady_clock::now();
  do {
    local_368._M_unused._M_object = CScheduler::serviceQueue;
    local_368._8_8_ = 0;
    local_358._M_head_impl = &local_d0;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<std::_Bind<void(CScheduler::*(CScheduler*))()>>
              ((vector<std::thread,std::allocator<std::thread>> *)local_4a8,
               (_Bind<void_(CScheduler::*(CScheduler_*))()> *)&local_368);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  iVar9 = 0;
  do {
    do {
      uVar6 = RandomMixin<FastRandomContext>::randbits
                        (&local_320.super_RandomMixin<FastRandomContext>,10);
    } while (0x3f3 < uVar6);
    do {
      pCVar7 = (CScheduler *)
               RandomMixin<FastRandomContext>::randbits
                         (&local_320.super_RandomMixin<FastRandomContext>,10);
      pCVar1 = pCVar13;
      if ((CScheduler *)0x3f3 >= pCVar7) {
        pCVar1 = pCVar7;
      }
      pCVar13 = (CScheduler *)((ulong)pCVar1 & 0xffffffff);
    } while ((CScheduler *)0x3f3 < pCVar7);
    do {
      uVar6 = RandomMixin<FastRandomContext>::randbits
                        (&local_320.super_RandomMixin<FastRandomContext>,4);
    } while (9 < uVar6);
    do {
      uVar8 = RandomMixin<FastRandomContext>::randbits
                        (&local_320.super_RandomMixin<FastRandomContext>,0xb);
    } while (2000 < uVar8);
    local_358._M_head_impl = (CScheduler *)0x0;
    ppiStack_350 = (int **)0x0;
    local_368._M_unused._M_object = (_func_int **)0x0;
    local_368._8_8_ = 0;
    local_368._M_unused._M_object = operator_new(0x30);
    *(code **)local_368._M_unused._0_8_ = microTask;
    *(_func_int **)((long)local_368._M_unused._0_8_ + 8) =
         (_func_int *)((long)((int)pCVar1 + 0x1e9) * 1000 + lVar4);
    *(int *)((long)local_368._M_unused._0_8_ + 0x10) = (int)uVar8 + -1000;
    *(_func_int **)((long)local_368._M_unused._0_8_ + 0x18) =
         (_func_int *)((long)&local_298 + (long)(int)uVar6 * 4);
    *(undefined1 **)((long)local_368._M_unused._0_8_ + 0x20) = local_268 + (long)(int)uVar6 * 0x28;
    pCVar13 = &local_d0;
    *(CScheduler **)((long)local_368._M_unused._0_8_ + 0x28) = pCVar13;
    ppiStack_350 = (int **)std::
                           _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>_>
                           ::_M_invoke;
    local_358._M_head_impl =
         (CScheduler *)
         std::
         _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>_>
         ::_M_manager;
    std::function<void_()>::function((function<void_()> *)local_4c8,(function<void_()> *)&local_368)
    ;
    f_01.super__Function_base._M_functor._4_4_ = uVar15;
    f_01.super__Function_base._M_functor._0_4_ = uVar14;
    f_01.super__Function_base._M_functor._8_8_ = (undefined8)_cVar16;
    f_01.super__Function_base._M_manager = in_stack_fffffffffffffa88;
    f_01._M_invoker = in_stack_fffffffffffffa90;
    CScheduler::schedule(pCVar13,f_01,(time_point)local_4c8);
    if (local_4b8 != (code *)0x0) {
      (*local_4b8)(local_4c8,local_4c8,3);
    }
    if (local_358._M_head_impl != (CScheduler *)0x0) {
      (*(code *)local_358._M_head_impl)(&local_368,&local_368,3);
    }
    iVar9 = iVar9 + 1;
  } while (iVar9 != 100);
  CScheduler::StopWhenDrained(&local_d0);
  uVar3 = local_4a8._8_8_;
  for (iVar10._M_thread = local_4a8._0_8_; iVar10._M_thread != uVar3;
      iVar10._M_thread = iVar10._M_thread + 8) {
    if ((native_handle_type)*(id *)iVar10._M_thread != 0) {
      std::thread::join();
    }
  }
  local_4cc = 0;
  lVar4 = 0;
  do {
    local_4e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
    ;
    local_4d8 = "";
    local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x67;
    file_03.m_begin = (iterator)&local_4e0;
    msg_03.m_end = pvVar12;
    msg_03.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4f0,
               msg_03);
    local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)(*(int *)((long)&local_298 + lVar4 * 4) != 0);
    local_390.m_message.px = (element_type *)0x0;
    local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_540._0_8_ = "counter[i] != 0";
    local_540._8_8_ = "";
    local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
    local_368._M_unused._M_object = &PTR__lazy_ostream_013abc70;
    local_358._M_head_impl = (CScheduler *)boost::unit_test::lazy_ostream::inst;
    ppiStack_350 = (int **)local_540;
    local_500 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
    ;
    local_4f8 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_390,(lazy_ostream *)&local_368,1,0,WARN,_cVar16,(size_t)&local_500,0x67);
    boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
    local_4cc = local_4cc + *(int *)((long)&local_298 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x6a;
  file_04.m_begin = (iterator)&local_510;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_520,
             msg_04);
  local_540._8_8_ = local_540._8_8_ & 0xffffffffffffff00;
  local_540._0_8_ = &PTR__lazy_ostream_013abb30;
  local_530 = boost::unit_test::lazy_ostream::inst;
  local_528 = "";
  local_370 = &local_4cc;
  local_338.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_4cc == 200);
  local_398 = &local_544;
  local_544 = 200;
  local_338.m_message.px = (element_type *)0x0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_340 = "";
  ppiStack_350 = &local_370;
  local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
  local_368._M_unused._M_object = &PTR__lazy_ostream_013abcf0;
  local_358._M_head_impl = (CScheduler *)boost::unit_test::lazy_ostream::inst;
  local_378 = &local_398;
  local_390.m_message.px = (element_type *)((ulong)local_390.m_message.px & 0xffffffffffffff00);
  local_390._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_390.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_338,(lazy_ostream *)local_540,1,2,REQUIRE,0xec4fbb,(size_t)&local_348,0x6a,
             &local_368,"200",&local_390);
  boost::detail::shared_count::~shared_count(&local_338.m_message.pn);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_4a8);
  ChaCha20::~ChaCha20(&local_320.rng);
  CScheduler::~CScheduler(&local_d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(manythreads)
{
    // Stress test: hundreds of microsecond-scheduled tasks,
    // serviced by 10 threads.
    //
    // So... ten shared counters, which if all the tasks execute
    // properly will sum to the number of tasks done.
    // Each task adds or subtracts a random amount from one of the
    // counters, and then schedules another task 0-1000
    // microseconds in the future to subtract or add from
    // the counter -random_amount+1, so in the end the shared
    // counters should sum to the number of initial tasks performed.
    CScheduler microTasks;

    std::mutex counterMutex[10];
    int counter[10] = { 0 };
    FastRandomContext rng{/*fDeterministic=*/true};
    auto zeroToNine = [](FastRandomContext& rc) -> int { return rc.randrange(10); }; // [0, 9]
    auto randomMsec = [](FastRandomContext& rc) -> int { return -11 + (int)rc.randrange(1012); }; // [-11, 1000]
    auto randomDelta = [](FastRandomContext& rc) -> int { return -1000 + (int)rc.randrange(2001); }; // [-1000, 1000]

    auto start = std::chrono::steady_clock::now();
    auto now = start;
    std::chrono::steady_clock::time_point first, last;
    size_t nTasks = microTasks.getQueueInfo(first, last);
    BOOST_CHECK(nTasks == 0);

    for (int i = 0; i < 100; ++i) {
        auto t = now + std::chrono::microseconds(randomMsec(rng));
        auto tReschedule = now + std::chrono::microseconds(500 + randomMsec(rng));
        int whichCounter = zeroToNine(rng);
        CScheduler::Function f = std::bind(&microTask, std::ref(microTasks),
                                             std::ref(counterMutex[whichCounter]), std::ref(counter[whichCounter]),
                                             randomDelta(rng), tReschedule);
        microTasks.schedule(f, t);
    }
    nTasks = microTasks.getQueueInfo(first, last);
    BOOST_CHECK(nTasks == 100);
    BOOST_CHECK(first < last);
    BOOST_CHECK(last > now);

    // As soon as these are created they will start running and servicing the queue
    std::vector<std::thread> microThreads;
    microThreads.reserve(10);
    for (int i = 0; i < 5; i++)
        microThreads.emplace_back(std::bind(&CScheduler::serviceQueue, &microTasks));

    UninterruptibleSleep(std::chrono::microseconds{600});
    now = std::chrono::steady_clock::now();

    // More threads and more tasks:
    for (int i = 0; i < 5; i++)
        microThreads.emplace_back(std::bind(&CScheduler::serviceQueue, &microTasks));
    for (int i = 0; i < 100; i++) {
        auto t = now + std::chrono::microseconds(randomMsec(rng));
        auto tReschedule = now + std::chrono::microseconds(500 + randomMsec(rng));
        int whichCounter = zeroToNine(rng);
        CScheduler::Function f = std::bind(&microTask, std::ref(microTasks),
                                             std::ref(counterMutex[whichCounter]), std::ref(counter[whichCounter]),
                                             randomDelta(rng), tReschedule);
        microTasks.schedule(f, t);
    }

    // Drain the task queue then exit threads
    microTasks.StopWhenDrained();
    // wait until all the threads are done
    for (auto& thread: microThreads) {
        if (thread.joinable()) thread.join();
    }

    int counterSum = 0;
    for (int i = 0; i < 10; i++) {
        BOOST_CHECK(counter[i] != 0);
        counterSum += counter[i];
    }
    BOOST_CHECK_EQUAL(counterSum, 200);
}